

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O3

void __thiscall
OSTEI_VRR_Writer::WriteVRRSteps_
          (OSTEI_VRR_Writer *this,ostream *os,QAM *am,VRR_StepSet *vs,string *num_n)

{
  _Base_ptr *pp_Var1;
  Quartet *pQVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  _Base_ptr p_Var9;
  undefined1 *puVar10;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  pointer pcVar11;
  QAM *pQVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  string aover;
  string vrr_const1;
  string ppa;
  string aoppq;
  string vrr_const0;
  string primname;
  string vrr_const2;
  string vrr_const3;
  string stepdir;
  string srcname [8];
  string local_328;
  string local_308;
  string local_2e8;
  ostream *local_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [16];
  string local_290;
  string local_270;
  char *local_250;
  long local_248;
  char local_240 [16];
  QAM *local_230;
  Quartet *local_228;
  Quartet *local_220;
  Quartet *local_218;
  Quartet *local_210;
  Quartet *local_208;
  char *local_200;
  long local_1f8;
  char local_1f0 [16];
  string local_1e0;
  _Rb_tree_node_base *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  string local_188;
  string local_168;
  char *local_148;
  long local_140;
  char *local_128;
  long local_120;
  char *local_108;
  long local_100;
  char *local_e8;
  long local_e0;
  char *local_c8;
  long local_c0;
  char *local_a8;
  long local_a0;
  char *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  local_2c8 = os;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"// Forming ",0xb);
  local_168.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
  local_168._M_string_length = 4;
  local_168.field_2._M_local_buf[4] = '\0';
  local_230 = am;
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  ArrVarName((string *)local_2c0,am,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_2c0._0_8_,local_2c0._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(num_n->_M_dataplus)._M_p,num_n->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," * ",3);
  local_68 = *(undefined8 *)(local_230->qam)._M_elems;
  uStack_60 = *(undefined8 *)((local_230->qam)._M_elems + 2);
  pcVar11 = (local_230->tag)._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar11,pcVar11 + (local_230->tag)._M_string_length);
  auVar13._0_4_ = (int)local_68 + 2;
  auVar13._4_4_ = local_68._4_4_ + 2;
  auVar13._8_4_ = (int)uStack_60 + 2;
  auVar13._12_4_ = uStack_60._4_4_ + 2;
  auVar16._4_4_ = local_68._4_4_ + 1;
  auVar16._12_4_ = uStack_60._4_4_ + 1;
  auVar16._0_4_ = auVar16._4_4_;
  auVar16._8_4_ = auVar16._12_4_;
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar5,
                      (~((int)uStack_60 >> 0x1f) &
                      (uint)((auVar13._8_8_ & 0xffffffff) * (ulong)((int)uStack_60 + 1)) >> 1) *
                      (~((int)local_68 >> 0x1f) & (uint)(auVar13._0_4_ * ((int)local_68 + 1)) >> 1)
                      * (~(local_68._4_4_ >> 0x1f) & (uint)(auVar16._4_4_ * auVar13._4_4_) >> 1) *
                        (~(uStack_60._4_4_ >> 0x1f) &
                        (uint)((auVar16._8_8_ & 0xffffffff) * (ulong)auVar13._12_4_) >> 1));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"];\n",3);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
    operator_delete((void *)local_2c0._0_8_);
  }
  poVar5 = local_2c8;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_2c8,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"for(n = 0; n < ",0xf);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(num_n->_M_dataplus)._M_p,num_n->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"; ++n)  // loop over orders of auxiliary function\n",0x32);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  p_Var9 = (vs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1c0 = &(vs->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_1c0) {
    do {
      local_168._M_dataplus._M_p._0_4_ = *(undefined4 *)&p_Var9[0x30]._M_left;
      StringBuilder<char[2],int,char_const(&)[2]>
                (&local_1e0,(char (*) [2])0x14a083,(int *)&local_168,(char (*) [2])0x14c13c);
      local_168.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
      local_168._M_string_length = 4;
      local_168.field_2._M_local_buf[4] = '\0';
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      ArrVarName((string *)local_2c0,local_230,&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      local_1b8 = *(undefined8 *)(local_230->qam)._M_elems;
      uStack_1b0 = *(undefined8 *)((local_230->qam)._M_elems + 2);
      local_1a8[0] = local_198;
      pcVar11 = (local_230->tag)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar11,pcVar11 + (local_230->tag)._M_string_length);
      auVar14._0_4_ = (int)local_1b8 + 2;
      auVar14._4_4_ = local_1b8._4_4_ + 2;
      auVar14._8_4_ = (int)uStack_1b0 + 2;
      auVar14._12_4_ = uStack_1b0._4_4_ + 2;
      auVar15._4_4_ = local_1b8._4_4_ + 1;
      auVar15._12_4_ = uStack_1b0._4_4_ + 1;
      auVar15._0_4_ = auVar15._4_4_;
      auVar15._8_4_ = auVar15._12_4_;
      local_168._M_dataplus._M_p._0_4_ =
           (~((int)uStack_1b0 >> 0x1f) &
           (uint)((auVar14._8_8_ & 0xffffffff) * (ulong)((int)uStack_1b0 + 1)) >> 1) *
           (~((int)local_1b8 >> 0x1f) & (uint)(auVar14._0_4_ * ((int)local_1b8 + 1)) >> 1) *
           (~(local_1b8._4_4_ >> 0x1f) & (uint)(auVar15._4_4_ * auVar14._4_4_) >> 1) *
           (~(uStack_1b0._4_4_ >> 0x1f) &
           (uint)((auVar15._8_8_ & 0xffffffff) * (ulong)auVar14._12_4_) >> 1);
      pcVar7 = Quartet::index((Quartet *)&p_Var9[1]._M_parent,pcVar11,__c);
      local_328._M_dataplus._M_p._0_4_ = (int)pcVar7;
      StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
                (&local_270,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                 (char (*) [6])"[n * ",(int *)&local_168,(char (*) [4])0x14d039,(int *)&local_328,
                 (char (*) [2])0x14c13c);
      if (local_1a8[0] != local_198) {
        operator_delete(local_1a8[0]);
      }
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_);
      }
      lVar8 = 0x10;
      do {
        puVar10 = (undefined1 *)((long)&local_168._M_dataplus._M_p + lVar8);
        *(undefined1 **)((long)&local_188.field_2 + lVar8) = puVar10;
        *(undefined8 *)((long)&local_188.field_2 + lVar8 + 8) = 0;
        *puVar10 = 0;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x110);
      pp_Var1 = &p_Var9[6]._M_left;
      bVar3 = Quartet::operator_cast_to_bool((Quartet *)pp_Var1);
      if (bVar3) {
        pQVar12 = (QAM *)local_2c0;
        Quartet::amlist(pQVar12,(Quartet *)pp_Var1);
        local_328.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
        local_328._M_string_length = 4;
        local_328.field_2._M_local_buf[4] = '\0';
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        ArrVarName(&local_308,pQVar12,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        iVar4 = Quartet::ncart((Quartet *)pp_Var1);
        local_328._M_dataplus._M_p._0_4_ = iVar4;
        pcVar7 = Quartet::index((Quartet *)pp_Var1,(char *)pQVar12,__c_00);
        local_250 = (char *)CONCAT44(local_250._4_4_,(int)pcVar7);
        StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
                  (&local_290,&local_308,(char (*) [6])"[n * ",(int *)&local_328,
                   (char (*) [4])0x14d039,(int *)&local_250,(char (*) [2])0x14c13c);
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_290);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]) != local_2a0) {
          operator_delete((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]));
        }
      }
      local_208 = (Quartet *)&p_Var9[0xb]._M_right;
      bVar3 = Quartet::operator_cast_to_bool(local_208);
      if (bVar3) {
        pQVar12 = (QAM *)local_2c0;
        Quartet::amlist(pQVar12,local_208);
        local_328.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
        local_328._M_string_length = 4;
        local_328.field_2._M_local_buf[4] = '\0';
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        ArrVarName(&local_308,pQVar12,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        pQVar2 = local_208;
        iVar4 = Quartet::ncart(local_208);
        local_328._M_dataplus._M_p._0_4_ = iVar4;
        pcVar7 = Quartet::index(pQVar2,(char *)pQVar12,__c_01);
        local_250 = (char *)CONCAT44(local_250._4_4_,(int)pcVar7);
        StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                  (&local_290,&local_308,(char (*) [10])"[(n+1) * ",(int *)&local_328,
                   (char (*) [4])0x14d039,(int *)&local_250,(char (*) [2])0x14c13c);
        std::__cxx11::string::operator=((string *)&local_148,(string *)&local_290);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]) != local_2a0) {
          operator_delete((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]));
        }
      }
      local_210 = (Quartet *)(p_Var9 + 0x11);
      bVar3 = Quartet::operator_cast_to_bool(local_210);
      if (bVar3) {
        pQVar12 = (QAM *)local_2c0;
        Quartet::amlist(pQVar12,local_210);
        local_328.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
        local_328._M_string_length = 4;
        local_328.field_2._M_local_buf[4] = '\0';
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        ArrVarName(&local_308,pQVar12,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        pQVar2 = local_210;
        iVar4 = Quartet::ncart(local_210);
        local_328._M_dataplus._M_p._0_4_ = iVar4;
        pcVar7 = Quartet::index(pQVar2,(char *)pQVar12,__c_02);
        local_250 = (char *)CONCAT44(local_250._4_4_,(int)pcVar7);
        StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
                  (&local_290,&local_308,(char (*) [6])"[n * ",(int *)&local_328,
                   (char (*) [4])0x14d039,(int *)&local_250,(char (*) [2])0x14c13c);
        std::__cxx11::string::operator=((string *)&local_128,(string *)&local_290);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]) != local_2a0) {
          operator_delete((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]));
        }
      }
      local_220 = (Quartet *)&p_Var9[0x16]._M_parent;
      bVar3 = Quartet::operator_cast_to_bool(local_220);
      if (bVar3) {
        pQVar12 = (QAM *)local_2c0;
        Quartet::amlist(pQVar12,local_220);
        local_328.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
        local_328._M_string_length = 4;
        local_328.field_2._M_local_buf[4] = '\0';
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        ArrVarName(&local_308,pQVar12,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        pQVar2 = local_220;
        iVar4 = Quartet::ncart(local_220);
        local_328._M_dataplus._M_p._0_4_ = iVar4;
        pcVar7 = Quartet::index(pQVar2,(char *)pQVar12,__c_03);
        local_250 = (char *)CONCAT44(local_250._4_4_,(int)pcVar7);
        StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                  (&local_290,&local_308,(char (*) [10])"[(n+1) * ",(int *)&local_328,
                   (char (*) [4])0x14d039,(int *)&local_250,(char (*) [2])0x14c13c);
        std::__cxx11::string::operator=((string *)&local_108,(string *)&local_290);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]) != local_2a0) {
          operator_delete((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]));
        }
      }
      local_218 = (Quartet *)&p_Var9[0x1b]._M_left;
      bVar3 = Quartet::operator_cast_to_bool(local_218);
      if (bVar3) {
        pQVar12 = (QAM *)local_2c0;
        Quartet::amlist(pQVar12,local_218);
        local_328.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
        local_328._M_string_length = 4;
        local_328.field_2._M_local_buf[4] = '\0';
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        ArrVarName(&local_308,pQVar12,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        pQVar2 = local_218;
        iVar4 = Quartet::ncart(local_218);
        local_328._M_dataplus._M_p._0_4_ = iVar4;
        pcVar7 = Quartet::index(pQVar2,(char *)pQVar12,__c_04);
        local_250 = (char *)CONCAT44(local_250._4_4_,(int)pcVar7);
        StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
                  (&local_290,&local_308,(char (*) [6])"[n * ",(int *)&local_328,
                   (char (*) [4])0x14d039,(int *)&local_250,(char (*) [2])0x14c13c);
        std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_290);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]) != local_2a0) {
          operator_delete((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]));
        }
      }
      local_228 = (Quartet *)&p_Var9[0x20]._M_right;
      bVar3 = Quartet::operator_cast_to_bool(local_228);
      if (bVar3) {
        pQVar12 = (QAM *)local_2c0;
        Quartet::amlist(pQVar12,local_228);
        local_328.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
        local_328._M_string_length = 4;
        local_328.field_2._M_local_buf[4] = '\0';
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        ArrVarName(&local_308,pQVar12,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        pQVar2 = local_228;
        iVar4 = Quartet::ncart(local_228);
        local_328._M_dataplus._M_p._0_4_ = iVar4;
        pcVar7 = Quartet::index(pQVar2,(char *)pQVar12,__c_05);
        local_250 = (char *)CONCAT44(local_250._4_4_,(int)pcVar7);
        StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                  (&local_290,&local_308,(char (*) [10])"[(n+1) * ",(int *)&local_328,
                   (char (*) [4])0x14d039,(int *)&local_250,(char (*) [2])0x14c13c);
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_290);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]) != local_2a0) {
          operator_delete((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]));
        }
      }
      pQVar2 = (Quartet *)(p_Var9 + 0x26);
      bVar3 = Quartet::operator_cast_to_bool(pQVar2);
      if (bVar3) {
        pQVar12 = (QAM *)local_2c0;
        Quartet::amlist(pQVar12,pQVar2);
        local_328.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
        local_328._M_string_length = 4;
        local_328.field_2._M_local_buf[4] = '\0';
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        ArrVarName(&local_308,pQVar12,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        iVar4 = Quartet::ncart(pQVar2);
        local_328._M_dataplus._M_p._0_4_ = iVar4;
        pcVar7 = Quartet::index(pQVar2,(char *)pQVar12,__c_06);
        local_250 = (char *)CONCAT44(local_250._4_4_,(int)pcVar7);
        StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                  (&local_290,&local_308,(char (*) [10])"[(n+1) * ",(int *)&local_328,
                   (char (*) [4])0x14d039,(int *)&local_250,(char (*) [2])0x14c13c);
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_290);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]) != local_2a0) {
          operator_delete((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]));
        }
      }
      pp_Var1 = &p_Var9[0x2b]._M_parent;
      bVar3 = Quartet::operator_cast_to_bool((Quartet *)pp_Var1);
      if (bVar3) {
        pQVar12 = (QAM *)local_2c0;
        Quartet::amlist(pQVar12,(Quartet *)pp_Var1);
        local_328.field_2._M_allocated_capacity._0_4_ = 0x4d495250;
        local_328._M_string_length = 4;
        local_328.field_2._M_local_buf[4] = '\0';
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        ArrVarName(&local_308,pQVar12,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        iVar4 = Quartet::ncart((Quartet *)pp_Var1);
        local_328._M_dataplus._M_p._0_4_ = iVar4;
        pcVar7 = Quartet::index((Quartet *)pp_Var1,(char *)pQVar12,__c_07);
        local_250 = (char *)CONCAT44(local_250._4_4_,(int)pcVar7);
        StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                  (&local_290,&local_308,(char (*) [10])"[(n+1) * ",(int *)&local_328,
                   (char (*) [4])0x14d039,(int *)&local_250,(char (*) [2])0x14c13c);
        std::__cxx11::string::operator=((string *)&local_88,(string *)&local_290);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]) != local_2a0) {
          operator_delete((undefined1 *)CONCAT71(local_2c0._17_7_,local_2c0[0x10]));
        }
      }
      local_2c0._0_8_ = local_2c0 + 0x10;
      local_2c0._8_8_ = 0;
      local_2c0[0x10] = '\0';
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      local_328._M_string_length = 0;
      local_328.field_2._M_allocated_capacity._0_4_ =
           local_328.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      local_290._M_string_length = 0;
      local_290.field_2._M_local_buf[0] = '\0';
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      local_308._M_string_length = 0;
      local_308.field_2._M_local_buf[0] = '\0';
      local_250 = local_240;
      local_248 = 0;
      local_240[0] = '\0';
      local_200 = local_1f0;
      local_1f8 = 0;
      local_1f0[0] = '\0';
      if (p_Var9[1]._M_color < 2) {
        StringBuilder<char[7],std::__cxx11::string&>(&local_2e8,(char (*) [7])"aop_PQ",&local_1e0);
        std::__cxx11::string::operator=((string *)local_2c0,(string *)&local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&local_328,0,(char *)local_328._M_string_length,0x1499dd);
        StringBuilder<char[11],int_const&,char_const(&)[9]>
                  (&local_2e8,(char (*) [11])0x149bed,(int *)((long)&p_Var9[0x30]._M_left + 4),
                   (char (*) [9])0x1499f0);
        std::__cxx11::string::operator=((string *)&local_290,(string *)&local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
        StringBuilder<char[11],int_const&,char_const(&)[9]>
                  (&local_2e8,(char (*) [11])0x149bed,(int *)&p_Var9[0x30]._M_right,
                   (char (*) [9])0x1499f0);
        std::__cxx11::string::operator=((string *)&local_308,(string *)&local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
        StringBuilder<char[11],int_const&,char_const(&)[10]>
                  (&local_2e8,(char (*) [11])0x149bed,(int *)((long)&p_Var9[0x30]._M_right + 4),
                   (char (*) [10])0x1499d3);
        std::__cxx11::string::operator=((string *)&local_250,(string *)&local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
        StringBuilder<char[11],int_const&,char_const(&)[10]>
                  (&local_2e8,(char (*) [11])0x149bed,(int *)(p_Var9 + 0x31),(char (*) [10])0x1499d3
                  );
      }
      else {
        StringBuilder<char[7],std::__cxx11::string&>(&local_2e8,(char (*) [7])"aoq_PQ",&local_1e0);
        std::__cxx11::string::operator=((string *)local_2c0,(string *)&local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&local_328,0,(char *)local_328._M_string_length,0x1499f9);
        StringBuilder<char[11],int_const&,char_const(&)[9]>
                  (&local_2e8,(char (*) [11])0x149bed,(int *)((long)&p_Var9[0x30]._M_right + 4),
                   (char (*) [9])0x149a0c);
        std::__cxx11::string::operator=((string *)&local_290,(string *)&local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
        StringBuilder<char[11],int_const&,char_const(&)[9]>
                  (&local_2e8,(char (*) [11])0x149bed,(int *)(p_Var9 + 0x31),(char (*) [9])0x149a0c)
        ;
        std::__cxx11::string::operator=((string *)&local_308,(string *)&local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
        StringBuilder<char[11],int_const&,char_const(&)[10]>
                  (&local_2e8,(char (*) [11])0x149bed,(int *)((long)&p_Var9[0x30]._M_left + 4),
                   (char (*) [10])0x1499d3);
        std::__cxx11::string::operator=((string *)&local_250,(string *)&local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
        StringBuilder<char[11],int_const&,char_const(&)[10]>
                  (&local_2e8,(char (*) [11])0x149bed,(int *)&p_Var9[0x30]._M_right,
                   (char (*) [10])0x1499d3);
      }
      std::__cxx11::string::operator=((string *)&local_200,(string *)&local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      if (p_Var9[1]._M_color < 2) {
        StringBuilder<char[5],std::__cxx11::string&>(&local_2e8,(char (*) [5])"P_PA",&local_1e0);
        if (p_Var9[1]._M_color != _S_red) {
          StringBuilder<char[5],std::__cxx11::string&>(&local_188,(char (*) [5])"P_PB",&local_1e0);
          std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_188);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_2c8,indent6_abi_cxx11_._M_dataplus._M_p,
                            indent6_abi_cxx11_._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = SIMINT_MUL(",0xe);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_168._M_dataplus._M_p,local_168._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
      }
      else {
        StringBuilder<char[5],std::__cxx11::string&>(&local_2e8,(char (*) [5])"Q_PA",&local_1e0);
        if (p_Var9[1]._M_color != 2) {
          StringBuilder<char[5],std::__cxx11::string&>(&local_188,(char (*) [5])"Q_PB",&local_1e0);
          std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_188);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p);
          }
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_2c8,indent6_abi_cxx11_._M_dataplus._M_p,
                            indent6_abi_cxx11_._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = SIMINT_MUL(",0xe);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_168._M_dataplus._M_p,local_168._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      bVar3 = Quartet::operator_cast_to_bool(local_208);
      if (bVar3) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_2c8,indent6_abi_cxx11_._M_dataplus._M_p,
                            indent6_abi_cxx11_._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = SIMINT_FMADD( ",0x11);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_2c0._0_8_,local_2c0._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_148,local_140);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
      }
      bVar3 = Quartet::operator_cast_to_bool(local_210);
      if ((bVar3) && (bVar3 = Quartet::operator_cast_to_bool(local_220), bVar3)) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_2c8,indent6_abi_cxx11_._M_dataplus._M_p,
                            indent6_abi_cxx11_._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = SIMINT_FMADD( ",0x11);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", SIMINT_FMADD(",0xf);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_328._M_dataplus._M_p,local_328._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_108,local_100);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_128,local_120);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"), ",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
      }
      bVar3 = Quartet::operator_cast_to_bool(local_218);
      if ((bVar3) && (bVar3 = Quartet::operator_cast_to_bool(local_228), bVar3)) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_2c8,indent6_abi_cxx11_._M_dataplus._M_p,
                            indent6_abi_cxx11_._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = SIMINT_FMADD( ",0x11);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_308._M_dataplus._M_p,local_308._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", SIMINT_FMADD(",0xf);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_328._M_dataplus._M_p,local_328._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_c8,local_c0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_e8,local_e0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"), ",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
      }
      bVar3 = Quartet::operator_cast_to_bool(pQVar2);
      if (bVar3) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_2c8,indent6_abi_cxx11_._M_dataplus._M_p,
                            indent6_abi_cxx11_._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = SIMINT_FMADD( ",0x11);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_250,local_248);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_a8,local_a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
      }
      bVar3 = Quartet::operator_cast_to_bool((Quartet *)pp_Var1);
      if (bVar3) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_2c8,indent6_abi_cxx11_._M_dataplus._M_p,
                            indent6_abi_cxx11_._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = SIMINT_FMADD( ",0x11);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_200,local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_88,local_80);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,");\n",3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_2c8,"\n",1);
      if (local_200 != local_1f0) {
        operator_delete(local_200);
      }
      if (local_250 != local_240) {
        operator_delete(local_250);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
        operator_delete((void *)local_2c0._0_8_);
      }
      lVar8 = 0;
      do {
        if (local_78 + lVar8 != *(undefined1 **)((long)&local_88 + lVar8)) {
          operator_delete(*(undefined1 **)((long)&local_88 + lVar8));
        }
        lVar8 = lVar8 + -0x20;
      } while (lVar8 != -0x100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_1c0);
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_2c8,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRRSteps_(std::ostream & os, QAM am, const VRR_StepSet & vs, const std::string & num_n) const
{
    os << "\n";
    os << indent5 << "// Forming " << PrimVarName(am) << "[" << num_n << " * " << NCART(am) << "];\n";

    os << indent5 << "for(n = 0; n < " << num_n << "; ++n)  // loop over orders of auxiliary function\n";
    os << indent5 << "{\n";

    os << "\n";

    // iterate over the requirements
    // should be in order since it's a set
    for(const auto & it : vs)
    {
        // Get the stepping
        XYZStep step = it.xyz;
        std::string stepdir = StringBuilder("[", static_cast<int>(step), "]");

        std::string primname = StringBuilder(PrimVarName(am), "[n * ", NCART(am), " + ", it.target.index(), "]");
        std::string srcname[8];

        if(it.src[0])
            srcname[0] = StringBuilder(PrimVarName(it.src[0].amlist()), "[n * ", it.src[0].ncart(), " + ", it.src[0].index(), "]");
        if(it.src[1])
            srcname[1] = StringBuilder( PrimVarName(it.src[1].amlist()), "[(n+1) * ", it.src[1].ncart(), " + ", it.src[1].index(), "]");
        if(it.src[2])
            srcname[2] = StringBuilder(PrimVarName(it.src[2].amlist()), "[n * ", it.src[2].ncart(), " + ", it.src[2].index(), "]");
        if(it.src[3])
            srcname[3] = StringBuilder(PrimVarName(it.src[3].amlist()), "[(n+1) * ", it.src[3].ncart(), " + ", it.src[3].index(), "]");
        if(it.src[4])
            srcname[4] = StringBuilder(PrimVarName(it.src[4].amlist()), "[n * ", it.src[4].ncart(), " + ", it.src[4].index(), "]");
        if(it.src[5])
            srcname[5] = StringBuilder(PrimVarName(it.src[5].amlist()), "[(n+1) * ", it.src[5].ncart(), " + ", it.src[5].index(), "]");
        if(it.src[6])
            srcname[6] = StringBuilder(PrimVarName(it.src[6].amlist()), "[(n+1) * ", it.src[6].ncart(), " + ", it.src[6].index(), "]");
        if(it.src[7])
            srcname[7] = StringBuilder(PrimVarName(it.src[7].amlist()), "[(n+1) * ", it.src[7].ncart(), " + ", it.src[7].index(), "]");

        std::string aoppq, aover;
        std::string vrr_const0, vrr_const1, vrr_const2, vrr_const3;

        // Note - the signs on a_over_p, a_over_q, etc, are taken care of in FileWriter.cpp
        if(it.type == RRStepType::I || it.type == RRStepType::J)
        {
            aoppq = StringBuilder("aop_PQ", stepdir);
            aover = "a_over_p";
            vrr_const0 = StringBuilder("vrr_const_", it.ijkl[0], "_over_2p");
            vrr_const1 = StringBuilder("vrr_const_", it.ijkl[1], "_over_2p");
            vrr_const2 = StringBuilder("vrr_const_", it.ijkl[2], "_over_2pq");
            vrr_const3 = StringBuilder("vrr_const_", it.ijkl[3], "_over_2pq");
        }
        else
        {
            aoppq = StringBuilder("aoq_PQ", stepdir);
            aover = "a_over_q";
            vrr_const0 = StringBuilder("vrr_const_", it.ijkl[2], "_over_2q");
            vrr_const1 = StringBuilder("vrr_const_", it.ijkl[3], "_over_2q");
            vrr_const2 = StringBuilder("vrr_const_", it.ijkl[0], "_over_2pq");
            vrr_const3 = StringBuilder("vrr_const_", it.ijkl[1], "_over_2pq");
        }


        if(it.type == RRStepType::I || it.type == RRStepType::J)
        {
            std::string ppa = StringBuilder("P_PA", stepdir);

            if(it.type != RRStepType::I)
                ppa = StringBuilder("P_PB", stepdir);

            os << indent6 << primname << " = SIMINT_MUL(" << ppa << ", " << srcname[0] << ");\n";
        }
        else
        {
            std::string qpa = StringBuilder("Q_PA", stepdir);

            if(it.type != RRStepType::K)
                qpa = StringBuilder("Q_PB", stepdir);

            os << indent6 << primname << " = SIMINT_MUL(" << qpa << ", " << srcname[0] << ");\n";
        }

        if(it.src[1])
            os << indent6 << primname << " = SIMINT_FMADD( " << aoppq << ", " << srcname[1] << ", " << primname << ");\n";
        if(it.src[2] && it.src[3])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const0 << ", SIMINT_FMADD(" << aover << ", " << srcname[3] << ", " << srcname[2] << "), " << primname << ");\n";
        if(it.src[4] && it.src[5])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const1 << ", SIMINT_FMADD(" << aover << ", " << srcname[5] << ", " << srcname[4] << "), " << primname << ");\n";
        if(it.src[6])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const2 << ", " << srcname[6] << ", " << primname << ");\n";
        if(it.src[7])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const3 << ", " << srcname[7] << ", " << primname << ");\n";
        
        os << "\n";

    }

    os << indent5 << "}\n";
}